

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZChunkVector.h
# Opt level: O0

void __thiscall
TPZChunkVector<TPZGraphNode,_10>::~TPZChunkVector(TPZChunkVector<TPZGraphNode,_10> *this,void **vtt)

{
  TPZManVector<TPZGraphNode_*,_10> *pTVar1;
  TPZGraphNode *pTVar2;
  int64_t iVar3;
  TPZGraphNode **ppTVar4;
  undefined8 *in_RSI;
  TPZSavable *in_RDI;
  int64_t i;
  int64_t nchunks;
  TPZManVector<TPZGraphNode_*,_10> *in_stack_ffffffffffffff90;
  TPZManVector<TPZGraphNode_*,_10> *pTVar5;
  int64_t local_20;
  
  in_RDI->_vptr_TPZSavable = (_func_int **)*in_RSI;
  iVar3 = TPZVec<TPZGraphNode_*>::NElements((TPZVec<TPZGraphNode_*> *)(in_RDI + 2));
  for (local_20 = 0; local_20 < iVar3; local_20 = local_20 + 1) {
    ppTVar4 = TPZVec<TPZGraphNode_*>::operator[]((TPZVec<TPZGraphNode_*> *)(in_RDI + 2),local_20);
    if (*ppTVar4 != (TPZGraphNode *)0x0) {
      ppTVar4 = TPZVec<TPZGraphNode_*>::operator[]((TPZVec<TPZGraphNode_*> *)(in_RDI + 2),local_20);
      pTVar1 = (TPZManVector<TPZGraphNode_*,_10> *)*ppTVar4;
      if (pTVar1 != (TPZManVector<TPZGraphNode_*,_10> *)0x0) {
        pTVar2 = pTVar1[-1].fExtAlloc[9];
        pTVar5 = (TPZManVector<TPZGraphNode_*,_10> *)(pTVar1->fExtAlloc + (long)pTVar2 * 6 + -4);
        while (pTVar1 != pTVar5) {
          pTVar5 = (TPZManVector<TPZGraphNode_*,_10> *)(pTVar5[-1].fExtAlloc + 4);
          TPZGraphNode::~TPZGraphNode((TPZGraphNode *)0x1c8df42);
          in_stack_ffffffffffffff90 = pTVar5;
        }
        operator_delete__(pTVar1[-1].fExtAlloc + 9,(long)pTVar2 * 0x30 + 8);
      }
    }
  }
  TPZManVector<TPZGraphNode_*,_10>::~TPZManVector(in_stack_ffffffffffffff90);
  TPZSavable::~TPZSavable(in_RDI,(void **)(in_RSI + 1));
  return;
}

Assistant:

TPZChunkVector<T, EXP>::~TPZChunkVector() {
    int64_t nchunks = fVec.NElements();

    for (int64_t i = 0; i < nchunks; i++) {
        if (fVec[i]) delete[] fVec[i];
    }
}